

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::PortConnection::ConnMap::ConnMap
          (ConnMap *this,SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          Scope *scope,LookupLocation lookupLocation)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  long lVar2;
  char *pcVar3;
  SyntaxKind SVar4;
  NamedParamAssignmentSyntax *this_01;
  long lVar5;
  ulong uVar6;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  size_t __n;
  char *__s1;
  int iVar7;
  ulong uVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  SourceLocation SVar10;
  uint64_t hash;
  Diagnostic *pDVar11;
  bool bVar12;
  uint uVar13;
  undefined8 uVar14;
  ulong pos0;
  long lVar15;
  ulong uVar16;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
  *ppVar17;
  bool bVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  SourceRange SVar37;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar38;
  LookupLocation lookupLocation_00;
  try_emplace_args_t local_131;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
  *local_130;
  Scope *local_128;
  string_view name;
  ulong local_100;
  PortConnectionSyntax *conn;
  locator res;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> local_58;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.data_ =
       (pointer)(this->orderedConns).
                super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.firstElement;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.len = 0;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.cap = 5;
  (this->namedConns).super_Storage.ptr = (char *)&this->namedConns;
  *(NamedConnMap **)&(this->namedConns).super_Storage.field_0x108 = &this->namedConns;
  *(undefined8 *)&(this->namedConns).field_0x110 = 0x3f;
  *(undefined8 *)&(this->namedConns).field_0x118 = 1;
  *(undefined1 (*) [16])&(this->namedConns).field_0x120 = (undefined1  [16])0x0;
  *(undefined1 **)&(this->namedConns).field_0x120 =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  uVar14 = 0x1d;
  if (*(long *)&(this->namedConns).field_0x128 == 0) {
    uVar14 = 0;
  }
  *(undefined8 *)&(this->namedConns).field_0x130 = uVar14;
  *(undefined1 (*) [16])&(this->namedConns).field_0x138 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->wildcardAttrs)._M_extent = (undefined1  [16])0x0;
  (this->wildcardRange).endLoc = (SourceLocation)0x0;
  this->usingOrdered = true;
  this->hasWildcard = false;
  uVar8 = (portConnections->elements)._M_extent._M_extent_value + 1;
  if (1 < uVar8) {
    this_00 = &(this->namedConns).super_Storage.field_0x108;
    bVar18 = false;
    uVar19 = 0;
    local_128 = scope;
    do {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((portConnections->elements)._M_ptr + uVar19 * 2));
      this_01 = (NamedParamAssignmentSyntax *)*ppSVar9;
      SVar4 = (this_01->super_ParamAssignmentSyntax).super_SyntaxNode.kind;
      bVar12 = SVar4 == EmptyPortConnection || SVar4 == OrderedPortConnection;
      conn = (PortConnectionSyntax *)this_01;
      if (bVar18) {
        if (this->usingOrdered == bVar12) goto LAB_004055ec;
        res._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_01);
        SVar10 = parsing::Token::location((Token *)&res);
        Scope::addDiag(local_128,(DiagCode)0x800006,SVar10);
        bVar12 = true;
      }
      else {
        this->usingOrdered = bVar12;
        bVar18 = true;
LAB_004055ec:
        if (SVar4 == EmptyPortConnection) {
LAB_00405601:
          SmallVectorBase<slang::syntax::PortConnectionSyntax_const*>::
          emplace_back<slang::syntax::PortConnectionSyntax_const*const&>
                    ((SmallVectorBase<slang::syntax::PortConnectionSyntax_const*> *)this,&conn);
        }
        else if (SVar4 == WildcardPortConnection) {
          bVar12 = this->hasWildcard;
          this->hasWildcard = true;
          if (bVar12 == false) {
            SVar37 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_01);
            this->wildcardRange = SVar37;
            syntax._M_ptr =
                 (conn->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr
            ;
            syntax._M_extent._M_extent_value =
                 (conn->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            lookupLocation_00._12_4_ = 0;
            lookupLocation_00.scope = (Scope *)SUB128(lookupLocation._0_12_,0);
            lookupLocation_00.index = SUB124(lookupLocation._0_12_,8);
            sVar38 = AttributeSymbol::fromSyntax(syntax,local_128,lookupLocation_00);
            this->wildcardAttrs = sVar38;
          }
          else {
            SVar37 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_01);
            pDVar11 = Scope::addDiag(local_128,(DiagCode)0x340006,SVar37);
            Diagnostic::addNote(pDVar11,(DiagCode)0xc0001,this->wildcardRange);
          }
        }
        else {
          if (SVar4 == OrderedPortConnection) goto LAB_00405601;
          name = parsing::Token::valueText((Token *)(this_01 + 1));
          if (name._M_len != 0) {
            local_58.second = false;
            local_58.first = this_01;
            hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this_00,&name);
            pos0 = hash >> ((this->namedConns).field_0x110 & 0x3f);
            lVar5 = *(long *)&(this->namedConns).field_0x120;
            lVar2 = (hash & 0xff) * 4;
            cVar21 = (&UNK_0046cabc)[lVar2];
            cVar22 = (&UNK_0046cabd)[lVar2];
            cVar23 = (&UNK_0046cabe)[lVar2];
            cVar24 = (&UNK_0046cabf)[lVar2];
            lVar2 = *(long *)&(this->namedConns).field_0x128;
            __n = name._M_len;
            __s1 = name._M_str;
            uVar6 = *(ulong *)&(this->namedConns).field_0x118;
            local_100 = 0;
            uVar16 = pos0;
            cVar25 = cVar21;
            cVar26 = cVar22;
            cVar27 = cVar23;
            cVar28 = cVar24;
            cVar29 = cVar21;
            cVar30 = cVar22;
            cVar31 = cVar23;
            cVar32 = cVar24;
            cVar33 = cVar21;
            cVar34 = cVar22;
            cVar35 = cVar23;
            cVar36 = cVar24;
            do {
              pcVar3 = (char *)(lVar5 + uVar16 * 0x10);
              auVar20[0] = -(*pcVar3 == cVar21);
              auVar20[1] = -(pcVar3[1] == cVar22);
              auVar20[2] = -(pcVar3[2] == cVar23);
              auVar20[3] = -(pcVar3[3] == cVar24);
              auVar20[4] = -(pcVar3[4] == cVar25);
              auVar20[5] = -(pcVar3[5] == cVar26);
              auVar20[6] = -(pcVar3[6] == cVar27);
              auVar20[7] = -(pcVar3[7] == cVar28);
              auVar20[8] = -(pcVar3[8] == cVar29);
              auVar20[9] = -(pcVar3[9] == cVar30);
              auVar20[10] = -(pcVar3[10] == cVar31);
              auVar20[0xb] = -(pcVar3[0xb] == cVar32);
              auVar20[0xc] = -(pcVar3[0xc] == cVar33);
              auVar20[0xd] = -(pcVar3[0xd] == cVar34);
              auVar20[0xe] = -(pcVar3[0xe] == cVar35);
              auVar20[0xf] = -(pcVar3[0xf] == cVar36);
              uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
              if (uVar13 != 0) {
                lVar15 = lVar2 + uVar16 * 0x1e0;
                local_48 = cVar21;
                cStack_47 = cVar22;
                cStack_46 = cVar23;
                cStack_45 = cVar24;
                cStack_44 = cVar25;
                cStack_43 = cVar26;
                cStack_42 = cVar27;
                cStack_41 = cVar28;
                cStack_40 = cVar29;
                cStack_3f = cVar30;
                cStack_3e = cVar31;
                cStack_3d = cVar32;
                cStack_3c = cVar33;
                cStack_3b = cVar34;
                cStack_3a = cVar35;
                cStack_39 = cVar36;
                do {
                  iVar7 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                    }
                  }
                  bVar12 = __n == *(size_t *)(lVar15 + (ulong)(uint)(iVar7 << 5));
                  ppVar17 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                             *)(lVar15 + (ulong)(uint)(iVar7 << 5));
                  if (bVar12 && __n != 0) {
                    iVar7 = bcmp(__s1,(ppVar17->first)._M_str,__n);
                    bVar12 = iVar7 == 0;
                    cVar21 = local_48;
                    cVar22 = cStack_47;
                    cVar23 = cStack_46;
                    cVar24 = cStack_45;
                    cVar25 = cStack_44;
                    cVar26 = cStack_43;
                    cVar27 = cStack_42;
                    cVar28 = cStack_41;
                    cVar29 = cStack_40;
                    cVar30 = cStack_3f;
                    cVar31 = cStack_3e;
                    cVar32 = cStack_3d;
                    cVar33 = cStack_3c;
                    cVar34 = cStack_3b;
                    cVar35 = cStack_3a;
                    cVar36 = cStack_39;
                  }
                  if (bVar12) goto LAB_00405904;
                  uVar13 = uVar13 - 1 & uVar13;
                } while (uVar13 != 0);
              }
              if ((*(byte *)(uVar16 * 0x10 + lVar5 + 0xf) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
              lVar15 = uVar16 + local_100;
              local_100 = local_100 + 1;
              uVar16 = lVar15 + 1U & uVar6;
            } while (local_100 <= uVar6);
            local_130 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                         *)0x0;
            ppVar17 = local_130;
LAB_00405904:
            local_130 = ppVar17;
            ppVar17 = local_130;
            if (local_130 ==
                (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                 *)0x0) {
              if (*(ulong *)&(this->namedConns).field_0x138 <
                  *(ulong *)&(this->namedConns).field_0x130) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                                 *)this_00,(arrays_type *)&(this->namedConns).field_0x110,pos0,hash,
                           &local_131,&name,&local_58);
                puVar1 = &(this->namedConns).field_0x138;
                *(long *)puVar1 = *(long *)puVar1 + 1;
                ppVar17 = res.p;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                                 *)this_00,hash,&local_131,&name,&local_58);
                ppVar17 = res.p;
              }
            }
            if (local_130 !=
                (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                 *)0x0) {
              SVar10 = parsing::Token::location((Token *)(this_01 + 1));
              pDVar11 = Scope::addDiag(local_128,(DiagCode)0x330006,SVar10);
              Diagnostic::operator<<(pDVar11,name);
              SVar10 = parsing::Token::location((Token *)((ppVar17->second).first + 1));
              Diagnostic::addNote(pDVar11,(DiagCode)0xc0001,SVar10);
            }
          }
        }
        bVar12 = false;
      }
    } while ((!bVar12) && (uVar19 = uVar19 + 1, uVar19 != uVar8 >> 1));
  }
  return;
}

Assistant:

PortConnection::ConnMap::ConnMap(
    const syntax::SeparatedSyntaxList<syntax::PortConnectionSyntax>& portConnections,
    const Scope& scope, LookupLocation lookupLocation) {

    bool hasConnections = false;
    for (auto conn : portConnections) {
        bool isOrdered = conn->kind == SyntaxKind::OrderedPortConnection ||
                         conn->kind == SyntaxKind::EmptyPortConnection;
        if (!hasConnections) {
            hasConnections = true;
            usingOrdered = isOrdered;
        }
        else if (isOrdered != usingOrdered) {
            scope.addDiag(diag::MixingOrderedAndNamedPorts, conn->getFirstToken().location());
            break;
        }

        if (isOrdered) {
            orderedConns.push_back(conn);
        }
        else if (conn->kind == SyntaxKind::WildcardPortConnection) {
            if (!std::exchange(hasWildcard, true)) {
                wildcardRange = conn->sourceRange();
                wildcardAttrs = AttributeSymbol::fromSyntax(conn->attributes, scope,
                                                            lookupLocation);
            }
            else {
                auto& diag = scope.addDiag(diag::DuplicateWildcardPortConnection,
                                           conn->sourceRange());
                diag.addNote(diag::NotePreviousUsage, wildcardRange);
            }
        }
        else {
            auto& npc = conn->as<NamedPortConnectionSyntax>();
            auto name = npc.name.valueText();
            if (!name.empty()) {
                auto pair = namedConns.emplace(name, std::make_pair(&npc, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicatePortConnection, npc.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }
}